

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

void activate_randart_file(void)

{
  char *base;
  char *leaf;
  char *local_820;
  char local_808 [8];
  char old [1024];
  char new [1024];
  
  base = ANGBAND_DIR_ARCHIVE;
  if (archive_user_pfx == (char *)0x0) {
    local_820 = "";
  }
  else {
    local_820 = archive_user_pfx;
  }
  leaf = format("%srandart_%08lx.txt",local_820,(ulong)seed_randart);
  path_build(local_808,0x400,base,leaf);
  path_build(old + 0x3f8,0x400,ANGBAND_DIR_USER,"randart.txt");
  safe_setuid_grab();
  file_move(local_808,old + 0x3f8);
  safe_setuid_drop();
  return;
}

Assistant:

void activate_randart_file(void)
{
	char new[1024];
	char old[1024];

	/* Get the randart filename and path */
	path_build(old, sizeof(old), ANGBAND_DIR_ARCHIVE,
		format("%srandart_%08lx.txt",
		(archive_user_pfx) ? archive_user_pfx : "",
		(unsigned long)seed_randart));

	/* Move it into place */
	path_build(new, sizeof(new), ANGBAND_DIR_USER, "randart.txt");
	safe_setuid_grab();
	file_move(old, new);
	safe_setuid_drop();
}